

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManLevelRNum(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  int iVar5;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  iVar1 = p->nObjs;
LAB_00214da1:
  do {
    iVar5 = iVar1 + -1;
    if ((iVar1 < 1) || (pObj = Gia_ManObj(p,iVar5), pObj == (Gia_Obj_t *)0x0)) {
      return p->nLevels;
    }
    iVar1 = iVar5;
    if ((p->fGiaSimple == 0) && (iVar3 = Gia_ObjIsBuf(pObj), iVar3 != 0)) {
      iVar5 = iVar5 - (*(uint *)pObj & 0x1fffffff);
      iVar3 = Gia_ObjLevel(p,pObj);
    }
    else {
      uVar2 = (uint)*(ulong *)pObj;
      uVar4 = *(ulong *)pObj & 0x1fffffff;
      if (uVar4 == 0x1fffffff || (int)uVar2 < 0) {
        if (-1 < (int)uVar2 || (int)uVar4 == 0x1fffffff) {
          iVar5 = p->nLevels;
          iVar3 = Gia_ObjLevel(p,pObj);
          if (iVar3 < iVar5) {
            iVar3 = iVar5;
          }
          p->nLevels = iVar3;
          goto LAB_00214da1;
        }
        iVar5 = iVar5 - (uVar2 & 0x1fffffff);
        iVar3 = 1;
      }
      else {
        iVar3 = Gia_ObjLevel(p,pObj);
        Gia_ObjUpdateLevelId(p,iVar5 - (uVar2 & 0x1fffffff),iVar3 + 1);
        iVar5 = iVar5 - (*(uint *)&pObj->field_0x4 & 0x1fffffff);
        iVar3 = Gia_ObjLevel(p,pObj);
        iVar3 = iVar3 + 1;
      }
    }
    Gia_ObjUpdateLevelId(p,iVar5,iVar3);
  } while( true );
}

Assistant:

int Gia_ManLevelRNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), Gia_ObjLevel(p, pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1+Gia_ObjLevel(p, pObj) );
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId1(pObj, i), 1+Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1 );
        else
            p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}